

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctred.c
# Opt level: O3

void jpeg_idct_4x4(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short sVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  JSAMPLE *pJVar10;
  JSAMPLE JVar11;
  int iVar12;
  long lVar13;
  short sVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int aiStack_d4 [7];
  int aiStack_b8 [34];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  uVar8 = 9;
  lVar9 = 0;
  do {
    if ((int)lVar9 != 8) {
      sVar1 = *(short *)((long)coef_block + lVar9 + 0x10);
      sVar14 = *(short *)((long)coef_block + lVar9 + 0x20);
      if (sVar14 == 0 && sVar1 == 0) {
        if ((((*(short *)((long)coef_block + lVar9 + 0x30) != 0) ||
             (*(short *)((long)coef_block + lVar9 + 0x50) != 0)) ||
            (*(short *)((long)coef_block + lVar9 + 0x60) != 0)) ||
           (*(short *)((long)coef_block + lVar9 + 0x70) != 0)) {
          sVar14 = 0;
          goto LAB_0014b734;
        }
        iVar12 = (int)*(short *)((long)pvVar3 + lVar9) * (int)*(short *)((long)coef_block + lVar9) *
                 4;
        *(int *)((long)aiStack_d4 + lVar9 * 2 + 0x1c) = iVar12;
        *(int *)((long)aiStack_d4 + lVar9 * 2 + 0x3c) = iVar12;
        *(int *)((long)aiStack_d4 + lVar9 * 2 + 0x5c) = iVar12;
        lVar5 = 0x60;
      }
      else {
LAB_0014b734:
        lVar19 = (long)*(short *)((long)pvVar3 + lVar9) * (long)*(short *)((long)coef_block + lVar9)
                 * 0x4000;
        lVar20 = (long)*(short *)((long)pvVar3 + lVar9 + 0x60) *
                 (long)*(short *)((long)coef_block + lVar9 + 0x60) * -0x187e +
                 (long)*(short *)((long)pvVar3 + lVar9 + 0x20) * (long)sVar14 * 0x3b21;
        lVar15 = lVar19 - lVar20;
        lVar17 = (long)*(short *)((long)pvVar3 + lVar9 + 0x70) *
                 (long)*(short *)((long)coef_block + lVar9 + 0x70);
        lVar7 = (long)*(short *)((long)pvVar3 + lVar9 + 0x50) *
                (long)*(short *)((long)coef_block + lVar9 + 0x50);
        lVar13 = (long)*(short *)((long)pvVar3 + lVar9 + 0x30) *
                 (long)*(short *)((long)coef_block + lVar9 + 0x30);
        lVar16 = (long)*(short *)((long)pvVar3 + lVar9 + 0x10) * (long)sVar1;
        lVar5 = lVar16 * 0x21f9 + lVar13 * -0x4587 + lVar7 * 0x2e75 + lVar17 * -0x6c2;
        lVar7 = lVar16 * 0x5203 + lVar13 * 0x1ccd + lVar7 * -0x133e + lVar17 * -0x1050;
        lVar20 = lVar19 + 0x800 + lVar20;
        *(int *)((long)aiStack_d4 + lVar9 * 2 + 0x1c) = (int)((ulong)(lVar20 + lVar7) >> 0xc);
        *(int *)((long)aiStack_d4 + lVar9 * 2 + 0x7c) = (int)((ulong)(lVar20 - lVar7) >> 0xc);
        *(int *)((long)aiStack_d4 + lVar9 * 2 + 0x3c) = (int)(lVar15 + lVar5 + 0x800U >> 0xc);
        iVar12 = (int)((ulong)((lVar15 + 0x800) - lVar5) >> 0xc);
        lVar5 = 0x40;
      }
      *(int *)((long)aiStack_d4 + lVar9 * 2 + lVar5 + 0x1c) = iVar12;
    }
    uVar8 = uVar8 - 1;
    lVar9 = lVar9 + 2;
  } while (1 < uVar8);
  lVar9 = 7;
  do {
    pJVar10 = (JSAMPLE *)(*(long *)((long)output_buf + lVar9 + -7) + (ulong)output_col);
    iVar12 = aiStack_d4[lVar9 + 1];
    iVar4 = aiStack_d4[lVar9 + 2];
    if (aiStack_d4[lVar9 + 2] == 0 && iVar12 == 0) {
      iVar4 = 0;
      if (((aiStack_d4[lVar9 + 3] != 0) || (aiStack_d4[lVar9 + 5] != 0)) ||
         ((iVar4 = 0, aiStack_d4[lVar9 + 6] != 0 || (aiStack_d4[lVar9 + 7] != 0))))
      goto LAB_0014b8df;
      JVar11 = pJVar2[(ulong)(aiStack_d4[lVar9] + 0x10U >> 5 & 0x3ff) + 0x80];
      *pJVar10 = JVar11;
      pJVar10[1] = JVar11;
      pJVar10[2] = JVar11;
      lVar5 = 3;
    }
    else {
LAB_0014b8df:
      iVar6 = aiStack_d4[lVar9 + 6] * -0x187e + iVar4 * 0x3b21;
      iVar4 = aiStack_d4[lVar9] * 0x4000 - iVar6;
      iVar18 = iVar12 * 0x21f9 + aiStack_d4[lVar9 + 7] * -0x6c2 +
               aiStack_d4[lVar9 + 3] * -0x4587 + aiStack_d4[lVar9 + 5] * 0x2e75;
      iVar12 = iVar12 * 0x5203 + aiStack_d4[lVar9 + 7] * -0x1050 +
               aiStack_d4[lVar9 + 3] * 0x1ccd + aiStack_d4[lVar9 + 5] * -0x133e;
      iVar6 = aiStack_d4[lVar9] * 0x4000 + 0x40000 + iVar6;
      *pJVar10 = pJVar2[(ulong)((uint)(iVar6 + iVar12) >> 0x13 & 0x3ff) + 0x80];
      pJVar10[3] = pJVar2[(ulong)((uint)(iVar6 - iVar12) >> 0x13 & 0x3ff) + 0x80];
      pJVar10[1] = pJVar2[(ulong)(iVar4 + iVar18 + 0x40000U >> 0x13 & 0x3ff) + 0x80];
      JVar11 = pJVar2[(ulong)((uint)((iVar4 + 0x40000) - iVar18) >> 0x13 & 0x3ff) + 0x80];
      lVar5 = 2;
    }
    pJVar10[lVar5] = JVar11;
    lVar9 = lVar9 + 8;
    if (lVar9 == 0x27) {
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_4x4(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp2, tmp10, tmp12;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE * 4];   /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; inptr++, quantptr++, wsptr++, ctr--) {
    /* Don't bother to process column 4, because second pass won't use it */
    if (ctr == DCTSIZE - 4)
      continue;
    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 5] == 0 &&
        inptr[DCTSIZE * 6] == 0 && inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero; we need not examine term 4 for 4x4 output */
      int dcval = LEFT_SHIFT(DEQUANTIZE(inptr[DCTSIZE * 0],
                                        quantptr[DCTSIZE * 0]), PASS1_BITS);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;

      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS + 1);

    z2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp2 = MULTIPLY(z2, FIX_1_847759065) + MULTIPLY(z3, -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3,  FIX_0_899976223) + /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4,  FIX_2_562915447);  /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    wsptr[DCTSIZE * 0] =
      (int)DESCALE(tmp10 + tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 3] =
      (int)DESCALE(tmp10 - tmp2, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 1] =
      (int)DESCALE(tmp12 + tmp0, CONST_BITS - PASS1_BITS + 1);
    wsptr[DCTSIZE * 2] =
      (int)DESCALE(tmp12 - tmp0, CONST_BITS - PASS1_BITS + 1);
  }

  /* Pass 2: process 4 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 4; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* It's not clear whether a zero row test is worthwhile here ... */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval = range_limit[(int)DESCALE((JLONG)wsptr[0],
                                               PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp0 = LEFT_SHIFT((JLONG)wsptr[0], CONST_BITS + 1);

    tmp2 = MULTIPLY((JLONG)wsptr[2],  FIX_1_847759065) +
           MULTIPLY((JLONG)wsptr[6], -FIX_0_765366865);

    tmp10 = tmp0 + tmp2;
    tmp12 = tmp0 - tmp2;

    /* Odd part */

    z1 = (JLONG)wsptr[7];
    z2 = (JLONG)wsptr[5];
    z3 = (JLONG)wsptr[3];
    z4 = (JLONG)wsptr[1];

    tmp0 = MULTIPLY(z1, -FIX_0_211164243) + /* sqrt(2) * ( c3-c1) */
           MULTIPLY(z2,  FIX_1_451774981) + /* sqrt(2) * ( c3+c7) */
           MULTIPLY(z3, -FIX_2_172734803) + /* sqrt(2) * (-c1-c5) */
           MULTIPLY(z4,  FIX_1_061594337);  /* sqrt(2) * ( c5+c7) */

    tmp2 = MULTIPLY(z1, -FIX_0_509795579) + /* sqrt(2) * (c7-c5) */
           MULTIPLY(z2, -FIX_0_601344887) + /* sqrt(2) * (c5-c1) */
           MULTIPLY(z3, FIX_0_899976223) +  /* sqrt(2) * (c3-c7) */
           MULTIPLY(z4, FIX_2_562915447);   /* sqrt(2) * (c1+c3) */

    /* Final output stage */

    outptr[0] = range_limit[(int)DESCALE(tmp10 + tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[3] = range_limit[(int)DESCALE(tmp10 - tmp2,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)DESCALE(tmp12 + tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)DESCALE(tmp12 - tmp0,
                                         CONST_BITS + PASS1_BITS + 3 + 1) &
                            RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}